

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O0

void __thiscall
CCheckQueueControl<FrozenCleanupCheck>::~CCheckQueueControl
          (CCheckQueueControl<FrozenCleanupCheck> *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string lockname;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  void *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if ((*(bool *)&in_RDI->_M_string_length & 1U) == 0) {
    Wait((CCheckQueueControl<FrozenCleanupCheck> *)in_RDI);
  }
  if ((CCheckQueue<FakeCheckCheckCompletion> *)(in_RDI->_M_dataplus)._M_p !=
      (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
    file = &stack0xffffffffffffffd8;
    std::__cxx11::string::string(this_00);
    CheckLastCritical(in_stack_ffffffffffffffd8,this_00,(char *)in_RDI,file,
                      in_stack_ffffffffffffffbc);
    AnnotatedMixin<std::mutex>::unlock
              ((AnnotatedMixin<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    LeaveCritical();
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCheckQueueControl()
    {
        if (!fDone)
            Wait();
        if (pqueue != nullptr) {
            LEAVE_CRITICAL_SECTION(pqueue->m_control_mutex);
        }
    }